

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

object * player_best_digger(player *p,_Bool forbid_stack)

{
  uint8_t uVar1;
  _Bool _Var2;
  wchar_t slot;
  object *poVar3;
  object *poVar4;
  object *obj;
  int iVar5;
  player_state_conflict local_state;
  player_state_conflict local_150;
  
  slot = slot_by_name(p,"weapon");
  poVar3 = slot_object(p,slot);
  obj = p->gear;
  if (obj == (object *)0x0) {
    poVar4 = (object *)0x0;
  }
  else {
    iVar5 = -1;
    poVar4 = (object *)0x0;
    do {
      _Var2 = tval_is_melee_weapon(obj);
      if (((_Var2) && ((obj->number == '\x01' || !forbid_stack) && obj->number != '\0')) &&
         (_Var2 = obj_can_takeoff(obj), _Var2)) {
        uVar1 = obj->number;
        if (obj != poVar3) {
          obj->number = '\x01';
          (p->body).slots[slot].obj = obj;
        }
        local_150.stat_ind[0] = 0;
        local_150.stat_ind[3] = 0;
        calc_bonuses(p,&local_150,true,false);
        if (obj != poVar3) {
          obj->number = uVar1;
          (p->body).slots[slot].obj = poVar3;
        }
        if (iVar5 < local_150.skills[9]) {
          poVar4 = obj;
          iVar5 = local_150.skills[9];
        }
      }
      obj = obj->next;
    } while (obj != (object *)0x0);
  }
  return poVar4;
}

Assistant:

struct object *player_best_digger(struct player *p, bool forbid_stack)
{
	int weapon_slot = slot_by_name(p, "weapon");
	struct object *current_weapon = slot_object(p, weapon_slot);
	struct object *obj, *best = NULL;
	/* Prefer any melee weapon over unarmed digging, i.e. best == NULL. */
	int best_score = -1;
	struct player_state local_state;

	for (obj = p->gear; obj; obj = obj->next) {
		int score, old_number;
		if (!tval_is_melee_weapon(obj)) continue;
		if (obj->number < 1 || (forbid_stack && obj->number > 1)) continue;
		/* Don't use it if it has a sticky curse. */
		if (!obj_can_takeoff(obj)) continue;

		/* Swap temporarily for the calc_bonuses() computation. */
		old_number = obj->number;
		if (obj != current_weapon) {
			obj->number = 1;
			p->body.slots[weapon_slot].obj = obj;
		}

		/*
		 * Avoid side effects from using update set to false
		 * with calc_bonuses().
		 */
		local_state.stat_ind[STAT_STR] = 0;
		local_state.stat_ind[STAT_DEX] = 0;
		calc_bonuses(p, &local_state, true, false);
		score = local_state.skills[SKILL_DIGGING];

		/* Swap back. */
		if (obj != current_weapon) {
			obj->number = old_number;
			p->body.slots[weapon_slot].obj = current_weapon;
		}

		if (score > best_score) {
			best = obj;
			best_score = score;
		}
	}

	return best;
}